

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O2

exr_result_t
internal_exr_calc_header_version_flags(exr_const_context_t_conflict ctxt,uint32_t *flags)

{
  uint uVar1;
  exr_attribute_t *peVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar5 = (uint)(ctxt->is_multipart != '\0') << 0xc;
  uVar6 = uVar5 | 2;
  *flags = uVar6;
  if (0x1f < ctxt->max_name_length) {
    uVar7 = (ulong)(uint)ctxt->num_parts;
    if (ctxt->num_parts < 1) {
      uVar7 = 0;
    }
    uVar9 = 0;
    do {
      if (uVar9 == uVar7) goto LAB_0012281b;
      uVar1 = (ctxt->parts[uVar9]->attributes).num_attributes;
      uVar8 = 0;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = uVar8;
      }
      bVar3 = false;
      for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        peVar2 = (ctxt->parts[uVar9]->attributes).entries[uVar8];
        if ((0x1f < peVar2->name_length) || (0x1f < peVar2->type_name_length)) goto LAB_00122814;
        if (peVar2->type == EXR_ATTR_CHLIST) {
          uVar1 = ((peVar2->field_6).chlist)->num_channels;
          uVar12 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar12 = 0;
          }
          lVar11 = 0;
          do {
            if (uVar12 * 0x20 + 0x20 == lVar11 + 0x20) goto LAB_00122804;
            lVar4 = lVar11 + -0x15;
            lVar11 = lVar11 + 0x20;
          } while (*(int *)(((peVar2->field_6).chlist)->entries->reserved + lVar4) < 0x20);
          bVar3 = true;
        }
LAB_00122804:
      }
      uVar9 = uVar9 + 1;
    } while (!bVar3);
LAB_00122814:
    uVar6 = uVar5 | 0x402;
    *flags = uVar6;
  }
LAB_0012281b:
  if (ctxt->has_nonimage_data != '\0') {
    uVar6 = uVar6 | 0x800;
    *flags = uVar6;
  }
  if (ctxt->is_singlepart_tiled != '\0') {
    *flags = uVar6 | 0x200;
  }
  return 0;
}

Assistant:

exr_result_t internal_exr_calc_header_version_flags (exr_const_context_t ctxt, uint32_t *flags)
{
    *flags = 2; // EXR_VERSION

    if (ctxt->is_multipart) *flags |= EXR_MULTI_PART_FLAG;

    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
    {
        int longnamefound = 0;

        for ( int p = 0; p < ctxt->num_parts; ++p )
        {
            exr_priv_part_t curpart = ctxt->parts[p];
            for ( int a = 0; a < curpart->attributes.num_attributes; ++a )
            {
                exr_attribute_t *cura = curpart->attributes.entries[a];
                if (cura->name_length > EXR_SHORTNAME_MAXLEN ||
                    cura->type_name_length > EXR_SHORTNAME_MAXLEN)
                {
                    longnamefound = 1;
                    break;
                }

                // the original C++ side assumes there was
                // only one channel list (who would have multiple)
                // but let's not make that same assertion and check names
                // if we encounter any channel list named anything
                if (cura->type == EXR_ATTR_CHLIST)
                {
                    const exr_attr_chlist_t* chlist = cura->chlist;
                    int nc = chlist->num_channels;

                    for ( int c = 0; c < nc; ++c )
                    {
                        const exr_attr_chlist_entry_t *ce = chlist->entries + c;
                        if (ce->name.length > EXR_SHORTNAME_MAXLEN)
                        {
                            longnamefound = 1;
                            break;
                        }
                    }
                }
            }

            if (longnamefound)
                break;
        }

        if (longnamefound)
            *flags |= EXR_LONG_NAMES_FLAG;
    }

    if (ctxt->has_nonimage_data) *flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) *flags |= EXR_TILED_FLAG;

    return EXR_ERR_SUCCESS;
}